

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O0

natwm_error border_theme_from_config(map *map,char *key,border_theme **result)

{
  natwm_error nVar1;
  border_theme *theme_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar2;
  config_value *sticky_value;
  config_value *urgent_value;
  config_value *focused_value;
  config_value *unfocused_value;
  border_theme *theme;
  config_array *pcStack_30;
  natwm_error err;
  config_array *config_value;
  border_theme **result_local;
  char *key_local;
  map *map_local;
  
  uVar2 = 0x104659;
  pcStack_30 = (config_array *)0x0;
  config_value = (config_array *)result;
  result_local = (border_theme **)key;
  key_local = (char *)map;
  nVar1 = config_find_array(map,key,&stack0xffffffffffffffd0);
  if (nVar1 == NO_ERROR) {
    theme_00 = border_theme_create();
    if (theme_00 == (border_theme *)0x0) {
      map_local._4_4_ = MEMORY_ALLOCATION_ERROR;
    }
    else if (pcStack_30->length == 4) {
      if ((*pcStack_30->values)->type == NUMBER) {
        theme_00->unfocused = (uint16_t)((*pcStack_30->values)->data).number;
      }
      else {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Ignoring invalid unfocused config item inside \'%s\'",result_local,in_R8,
                        in_R9,uVar2);
      }
      if (pcStack_30->values[1]->type == NUMBER) {
        theme_00->focused = (uint16_t)(pcStack_30->values[1]->data).number;
      }
      else {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Ignoring invalid focused config item inside \'%s\'",result_local,in_R8,
                        in_R9,uVar2);
      }
      if (pcStack_30->values[2]->type == NUMBER) {
        theme_00->urgent = (uint16_t)(pcStack_30->values[2]->data).number;
      }
      else {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Ignoring invalid urgent config item inside \'%s\'",result_local,in_R8,in_R9
                        ,uVar2);
      }
      if (pcStack_30->values[3]->type == NUMBER) {
        theme_00->sticky = (uint16_t)(pcStack_30->values[3]->data).number;
      }
      else {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Ignoring invalid sticky config item inside \'%s\'",result_local);
      }
      config_value->length = (size_t)theme_00;
      map_local._4_4_ = NO_ERROR;
    }
    else {
      border_theme_destroy(theme_00);
      map_local._4_4_ = INVALID_INPUT_ERROR;
    }
  }
  else {
    map_local._4_4_ = nVar1;
    if (nVar1 == NOT_FOUND_ERROR) {
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find config item for \'%s\'",result_local,
                      in_R8,in_R9,uVar2);
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find border widths for config item \'%s\'"
                      ,result_local,in_R8,in_R9,uVar2);
    }
  }
  return map_local._4_4_;
}

Assistant:

enum natwm_error border_theme_from_config(const struct map *map, const char *key,
                                          struct border_theme **result)
{
        const struct config_array *config_value = NULL;
        enum natwm_error err = config_find_array(map, key, &config_value);

        if (err != NO_ERROR) {
                if (err == NOT_FOUND_ERROR) {
                        LOG_ERROR(natwm_logger, "Failed to find config item for '%s'", key);
                } else {
                        LOG_ERROR(natwm_logger,
                                  "Failed to find border widths for config "
                                  "item '%s'",
                                  key);
                }

                return err;
        }

        struct border_theme *theme = border_theme_create();

        if (theme == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        if (config_value->length != 4) {
                border_theme_destroy(theme);

                return INVALID_INPUT_ERROR;
        }

        const struct config_value *unfocused_value = config_value->values[0];

        if (unfocused_value->type != NUMBER) {
                LOG_WARNING(
                        natwm_logger, "Ignoring invalid unfocused config item inside '%s'", key);
        } else {
                theme->unfocused = (uint16_t)unfocused_value->data.number;
        }

        const struct config_value *focused_value = config_value->values[1];

        if (focused_value->type != NUMBER) {
                LOG_WARNING(natwm_logger, "Ignoring invalid focused config item inside '%s'", key);
        } else {
                theme->focused = (uint16_t)focused_value->data.number;
        }

        const struct config_value *urgent_value = config_value->values[2];

        if (urgent_value->type != NUMBER) {
                LOG_WARNING(natwm_logger, "Ignoring invalid urgent config item inside '%s'", key);
        } else {
                theme->urgent = (uint16_t)urgent_value->data.number;
        }

        const struct config_value *sticky_value = config_value->values[3];

        if (sticky_value->type != NUMBER) {
                LOG_WARNING(natwm_logger, "Ignoring invalid sticky config item inside '%s'", key);
        } else {
                theme->sticky = (uint16_t)sticky_value->data.number;
        }

        *result = theme;

        return NO_ERROR;
}